

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BReverbModel.cpp
# Opt level: O0

bool __thiscall MT32Emu::BReverbModelImpl<short>::isActive(BReverbModelImpl<short> *this)

{
  bool bVar1;
  uint uVar2;
  uint local_20;
  uint local_1c;
  Bit32u i_1;
  Bit32u i;
  BReverbModelImpl<short> *this_local;
  
  uVar2 = (*(this->super_BReverbModel)._vptr_BReverbModel[2])();
  if ((uVar2 & 1) != 0) {
    for (local_1c = 0; local_1c < this->currentSettings->numberOfAllpasses; local_1c = local_1c + 1)
    {
      bVar1 = RingBuffer<short>::isEmpty(&this->allpasses[local_1c]->super_RingBuffer<short>);
      if (!bVar1) {
        return true;
      }
    }
    for (local_20 = 0; local_20 < this->currentSettings->numberOfCombs; local_20 = local_20 + 1) {
      bVar1 = RingBuffer<short>::isEmpty(&this->combs[local_20]->super_RingBuffer<short>);
      if (!bVar1) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool isActive() const {
		if (!isOpen()) return false;
		for (Bit32u i = 0; i < currentSettings.numberOfAllpasses; i++) {
			if (!allpasses[i]->isEmpty()) return true;
		}
		for (Bit32u i = 0; i < currentSettings.numberOfCombs; i++) {
			if (!combs[i]->isEmpty()) return true;
		}
		return false;
	}